

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_rounding.cpp
# Opt level: O0

Precision *
icu_63::number::Precision::constructSignificant
          (Precision *__return_storage_ptr__,int32_t minSig,int32_t maxSig)

{
  PrecisionType local_2c;
  undefined1 local_28 [8];
  PrecisionUnion union_;
  FractionSignificantSettings settings;
  int32_t maxSig_local;
  int32_t minSig_local;
  
  union_.increment.fMinFrac = -1;
  union_.increment.fMaxFrac = -1;
  union_._12_2_ = (undefined2)minSig;
  union_._14_2_ = (undefined2)maxSig;
  local_28._4_2_ = union_._12_2_;
  local_28._0_2_ = -1;
  local_28._2_2_ = -1;
  local_28._6_2_ = union_._14_2_;
  local_2c = RND_SIGNIFICANT;
  settings._0_4_ = maxSig;
  settings._4_4_ = minSig;
  Precision(__return_storage_ptr__,&local_2c,(PrecisionUnion *)local_28,UNUM_FOUND_HALFEVEN);
  return __return_storage_ptr__;
}

Assistant:

Precision Precision::constructSignificant(int32_t minSig, int32_t maxSig) {
    FractionSignificantSettings settings;
    settings.fMinFrac = -1;
    settings.fMaxFrac = -1;
    settings.fMinSig = static_cast<digits_t>(minSig);
    settings.fMaxSig = static_cast<digits_t>(maxSig);
    PrecisionUnion union_;
    union_.fracSig = settings;
    return {RND_SIGNIFICANT, union_, kDefaultMode};
}